

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skiplist.cpp
# Opt level: O1

bool __thiscall Skiplist::put(Skiplist *this,uint64_t k,string *v,bool d)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  uint uVar4;
  _List_iterator<Quadlist_*> __tmp;
  Quadlist *pQVar5;
  _List_node_base *p_Var6;
  Quadlistnode *b;
  _List_node_base *p_Var7;
  Quadlistnode *pQVar8;
  reverse_iterator<std::_List_iterator<Quadlist_*>_> __tmp_1;
  Entry *e_00;
  Quadlistnode *pQVar9;
  bool bVar10;
  Entry e;
  iterator qlist;
  Quadlistnode *local_70;
  uint local_64;
  undefined1 local_60 [8];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  iterator local_38;
  
  Entry::Entry((Entry *)local_60);
  local_60 = (undefined1  [8])k;
  std::__cxx11::string::_M_assign((string *)&local_58);
  if ((this->super_list<Quadlist_*,_std::allocator<Quadlist_*>_>).
      super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node.
      super__List_node_base._M_next == (_List_node_base *)this) {
    pQVar5 = (Quadlist *)operator_new(0x18);
    Quadlist::init(pQVar5,(EVP_PKEY_CTX *)v);
    p_Var6 = (_List_node_base *)operator_new(0x18);
    p_Var6[1]._M_next = (_List_node_base *)pQVar5;
    std::__detail::_List_node_base::_M_hook(p_Var6);
    psVar1 = &(this->super_list<Quadlist_*,_std::allocator<Quadlist_*>_>).
              super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  local_38._M_node =
       (this->super_list<Quadlist_*,_std::allocator<Quadlist_*>_>).
       super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node.
       super__List_node_base._M_next;
  local_70 = (Quadlistnode *)(local_38._M_node[1]._M_next)->_M_prev[3]._M_prev;
  bVar3 = skipSearch1(this,&local_38,&local_70,k);
  pQVar8 = local_70;
  if (bVar3) {
    std::__cxx11::string::_M_assign((string *)&(local_70->entry).value);
    pQVar8->del = d;
    pQVar9 = local_70;
    while (pQVar8 = pQVar9->below, pQVar8 != (Quadlistnode *)0x0) {
      std::__cxx11::string::_M_assign((string *)&(pQVar8->entry).value);
      pQVar8->del = d;
      pQVar9 = pQVar8;
    }
  }
  else {
    e_00 = (Entry *)local_60;
    local_64 = (uint)d;
    b = Quadlist::insertAfterAbove
                  ((Quadlist *)
                   (this->super_list<Quadlist_*,_std::allocator<Quadlist_*>_>).
                   super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node.
                   super__List_node_base._M_prev[1]._M_next,e_00,local_70,(Quadlistnode *)0x0,d);
    p_Var6 = (_List_node_base *)this;
    pQVar8 = local_70;
    while (uVar4 = rand(), pQVar9 = local_70, (uVar4 & 1) != 0) {
      while( true ) {
        p_Var7 = p_Var6->_M_prev;
        p_Var2 = p_Var7[1]._M_next;
        bVar3 = pQVar8 == (Quadlistnode *)0x0;
        e_00 = (Entry *)CONCAT71((int7)((ulong)e_00 >> 8),bVar3);
        bVar10 = (Quadlistnode *)p_Var2[1]._M_next == pQVar8;
        if (bVar10 || bVar3) break;
        if (((Quadlistnode *)p_Var2->_M_prev == pQVar8) || (pQVar8->above != (Quadlistnode *)0x0)) {
          if ((!bVar10 && !bVar3) && ((Quadlistnode *)p_Var2->_M_prev != pQVar8)) {
            pQVar8 = pQVar8->above;
            goto LAB_00104e37;
          }
          break;
        }
        pQVar8 = pQVar8->pred;
      }
      if (p_Var7 == (this->super_list<Quadlist_*,_std::allocator<Quadlist_*>_>).
                    super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node.
                    super__List_node_base._M_next) {
        local_70 = pQVar8;
        pQVar5 = (Quadlist *)operator_new(0x18);
        Quadlist::init(pQVar5,(EVP_PKEY_CTX *)e_00);
        p_Var7 = (_List_node_base *)operator_new(0x18);
        p_Var7[1]._M_next = (_List_node_base *)pQVar5;
        std::__detail::_List_node_base::_M_hook(p_Var7);
        psVar1 = &(this->super_list<Quadlist_*,_std::allocator<Quadlist_*>_>).
                  super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        pQVar8 = pQVar5->header;
      }
      else {
        pQVar8 = (Quadlistnode *)(p_Var7->_M_prev[1]._M_next)->_M_prev;
      }
      pQVar8 = pQVar8->succ->pred;
LAB_00104e37:
      p_Var6 = p_Var6->_M_prev;
      e_00 = (Entry *)local_60;
      local_70 = pQVar8;
      b = Quadlist::insertAfterAbove
                    ((Quadlist *)p_Var6->_M_prev[1]._M_next,(Entry *)local_60,pQVar8,b,
                     SUB41(local_64,0));
    }
  }
  local_70 = pQVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool Skiplist::put(uint64_t k,const std::string &v,bool d) {
    Entry e;

    e.key=k;
    e.value=v;


    if(empty())
    {
        Quadlist * bottomm = new Quadlist();
        push_front(bottomm);

    }

    list::iterator qlist=begin();   //顶层那条四联表  用迭代器！！！
    Quadlistnode * p=(*qlist)->first();//顶层四联表的第一个元素

    //如果找到这个元素 改变他的值 为v
    //memtable里的k不重复 插入相同k直接覆盖
    if(skipSearch1(qlist,p,k))  //这里传的都是引用哦！！
    {
//        big-=p->entry.value.size();
      //  big+=v.size();
        p->entry.value=v;
        p->del=d;
        while (p->below)
        {
            p=p->below;
            p->entry.value=v;
            p->del=d;
        }
        return true;

    }


    //skipSearch之后 如果没找到 qlist就是底层，p是比k小的最大的那个
    list::reverse_iterator r_qlist=rbegin();
    Quadlistnode * b = (*r_qlist)->insertAfterAbove(e,p,nullptr,d); //新底座
    while(rand()&1)
    {
        //找到这条链比k小的 并且头上有东西的
        while ((*r_qlist)->valid(p) && !p->above) p=p->pred;

        //如果pred是header 就说明 比k小的没有这么高的了
        if(!(*r_qlist)->valid(p))
        {
            reverse_iterator temp =r_qlist;
            temp++;
            if(temp==rend()) //说明是顶层了
            {
                //新建一层
                Quadlist * newTop = new Quadlist();
                push_front(newTop);

                p=newTop->first()->pred;
            } else {
                reverse_iterator temp = r_qlist;
                temp++;
                p = (*temp)->first()->pred;  //让p等于上一层的header (private)}
            }

        }
        else{
            p=p->above;
        }

        r_qlist++;//上升一层
        b= (*r_qlist)->insertAfterAbove(e,p,b,d);
    }


    return true;
}